

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

bool __thiscall
MotionTrajectory::AddConstantAccel(MotionTrajectory *this,double acc,double vEnd,bool isInfinite)

{
  bool bVar1;
  ConstantAccel *this_00;
  ConstantAccel *local_38;
  MotionBase *motion;
  MotionBase *prevMotion;
  double dStack_20;
  bool isInfinite_local;
  double vEnd_local;
  double acc_local;
  MotionTrajectory *this_local;
  
  prevMotion._7_1_ = isInfinite;
  dStack_20 = vEnd;
  vEnd_local = acc;
  acc_local = (double)this;
  motion = GetLastMotion(this);
  this_00 = (ConstantAccel *)operator_new(0x50);
  ConstantAccel::ConstantAccel(this_00,vEnd_local,dStack_20,(bool)(prevMotion._7_1_ & 1),motion);
  local_38 = this_00;
  bVar1 = MotionBase::IsOK((MotionBase *)this_00);
  if (bVar1) {
    std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::push_back
              (&this->motionList,(value_type *)&local_38);
  }
  bVar1 = MotionBase::IsOK(&local_38->super_MotionBase);
  return bVar1;
}

Assistant:

bool MotionTrajectory::AddConstantAccel(double acc, double vEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantAccel(acc, vEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}